

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

void mi_os_free_huge_os_pages(void *p,size_t size)

{
  ulong in_RSI;
  size_t in_RDI;
  uint8_t *base;
  
  if ((in_RDI != 0) && (in_RSI != 0)) {
    for (; 0x3fffffff < in_RSI; in_RSI = in_RSI - 0x40000000) {
      mi_os_prim_free(base,in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

static void mi_os_free_huge_os_pages(void* p, size_t size) {
  if (p==NULL || size==0) return;
  uint8_t* base = (uint8_t*)p;
  while (size >= MI_HUGE_OS_PAGE_SIZE) {
    mi_os_prim_free(base, MI_HUGE_OS_PAGE_SIZE, MI_HUGE_OS_PAGE_SIZE);
    size -= MI_HUGE_OS_PAGE_SIZE;
    base += MI_HUGE_OS_PAGE_SIZE;
  }
}